

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O2

void __thiscall Assimp::AC3DImporter::Object::Object(Object *this,Object *param_1)

{
  aiVector2D aVar1;
  aiVector2D aVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  
  this->type = param_1->type;
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->texture,(string *)&param_1->texture);
  aVar1 = param_1->texRepeat;
  aVar2 = param_1->texOffset;
  fVar9 = (param_1->rotation).a1;
  fVar10 = (param_1->rotation).a2;
  fVar11 = (param_1->rotation).a3;
  fVar12 = (param_1->rotation).b1;
  fVar5 = (param_1->rotation).b2;
  fVar6 = (param_1->rotation).b3;
  fVar7 = (param_1->rotation).c1;
  fVar8 = (param_1->rotation).c2;
  fVar3 = (param_1->translation).y;
  fVar4 = (param_1->translation).z;
  *(undefined8 *)&(this->rotation).c3 = *(undefined8 *)&(param_1->rotation).c3;
  (this->translation).y = fVar3;
  (this->translation).z = fVar4;
  (this->rotation).b2 = fVar5;
  (this->rotation).b3 = fVar6;
  (this->rotation).c1 = fVar7;
  (this->rotation).c2 = fVar8;
  (this->rotation).a1 = fVar9;
  (this->rotation).a2 = fVar10;
  (this->rotation).a3 = fVar11;
  (this->rotation).b1 = fVar12;
  this->texRepeat = aVar1;
  this->texOffset = aVar2;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->crease = param_1->crease;
  uVar13 = param_1->subDiv;
  this->numRefs = param_1->numRefs;
  this->subDiv = uVar13;
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}